

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moldudp64.hh
# Opt level: O1

void __thiscall
helix::nasdaq::moldudp64_session<helix::parity::pmd_handler>::register_callback
          (moldudp64_session<helix::parity::pmd_handler> *this,event_callback *callback)

{
  _Any_data local_30;
  _Manager_type local_20;
  
  std::function<void_(const_helix::event_&)>::function
            ((function<void_(const_helix::event_&)> *)&local_30,callback);
  parity::pmd_handler::register_callback(&this->_handler,(event_callback *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return;
}

Assistant:

void moldudp64_session<Handler>::register_callback(event_callback callback)
{
    _handler.register_callback(callback);
}